

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O1

UMat * __thiscall
FlickerRemover::removeFlickering(FlickerRemover *this,UMat *frame,double timestamp,string *error)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  OpenCLKernels *this_00;
  pointer pUVar5;
  pointer pcVar6;
  uint uVar7;
  Size **ppSVar8;
  Size **ppSVar9;
  FlickerRemover *pFVar10;
  uint uVar11;
  bool bVar12;
  long *plVar13;
  undefined8 *puVar14;
  _Alloc_hider src_2;
  _InputArray *p_Var15;
  UMat *pUVar16;
  UMat *pUVar17;
  UMat *pUVar18;
  uint uVar19;
  Size *pSVar20;
  long *plVar21;
  ulong *puVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  uint uVar24;
  Size SVar25;
  undefined8 uVar26;
  ulong uVar27;
  Size SVar28;
  undefined8 uVar29;
  long lVar30;
  long lVar31;
  _InputArray local_208;
  long lStack_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  _OutputArray local_1c8;
  long lStack_1b0;
  _InputArray local_1a8;
  long lStack_190;
  string *local_180;
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  int local_154;
  string __str_2;
  string __str_1;
  string __str;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  UMat *local_b0;
  UMat *local_a8;
  string __str_3;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  FlickerRemover *local_40;
  CircularBuffer<cv::UMat_*> *local_38;
  
  iVar2 = this->frame_rows;
  if ((*(int *)(frame + 8) == iVar2) && (iVar3 = this->frame_cols, *(int *)(frame + 0xc) == iVar3))
  {
    dVar1 = this->expected_timestamp;
    if (((dVar1 != -1.0) || (NAN(dVar1))) &&
       (this->accepted_timestamp_difference <= ABS(dVar1 - timestamp))) {
      if (timestamp < dVar1) {
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   vsnprintf,0x148,"%f");
        plVar13 = (long *)std::__cxx11::string::replace((ulong)local_178,0,(char *)0x0,0x117c4e);
        ppSVar8 = (Size **)&local_1c8.super__InputArray.sz;
        pSVar20 = (Size *)(plVar13 + 2);
        if ((Size *)*plVar13 == pSVar20) {
          local_1c8.super__InputArray.sz = *pSVar20;
          lStack_1b0 = plVar13[3];
          local_1c8.super__InputArray._0_8_ = ppSVar8;
        }
        else {
          local_1c8.super__InputArray.sz = *pSVar20;
          local_1c8.super__InputArray._0_8_ = (Size *)*plVar13;
        }
        local_1c8.super__InputArray.obj = (void *)plVar13[1];
        *plVar13 = (long)pSVar20;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8);
        ppSVar9 = (Size **)&local_208.sz;
        pSVar20 = (Size *)(plVar13 + 2);
        if ((Size *)*plVar13 == pSVar20) {
          local_208.sz = *pSVar20;
          lStack_1f0 = plVar13[3];
          local_208._0_8_ = ppSVar9;
        }
        else {
          local_208.sz = *pSVar20;
          local_208._0_8_ = (Size *)*plVar13;
        }
        local_208.obj = (void *)plVar13[1];
        *plVar13 = (long)pSVar20;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_1e8,vsnprintf,0x148,"%f",SUB84(this->expected_timestamp,0));
        SVar28.width = 0xf;
        SVar28.height = 0;
        if ((Size **)local_208._0_8_ != ppSVar9) {
          SVar28 = local_208.sz;
        }
        if ((ulong)SVar28 < local_1e8._M_string_length + (long)local_208.obj) {
          uVar29._0_4_ = 0xf;
          uVar29._4_4_ = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            uVar29 = local_1e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar29 < local_1e8._M_string_length + (long)local_208.obj) goto LAB_0011103e;
          plVar13 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_1e8,0,(char *)0x0,local_208._0_8_);
        }
        else {
LAB_0011103e:
          plVar13 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_208,(ulong)local_1e8._M_dataplus._M_p);
        }
        local_1a8._0_8_ = &local_1a8.sz;
        pSVar20 = (Size *)(plVar13 + 2);
        if ((Size *)*plVar13 == pSVar20) {
          local_1a8.sz = *pSVar20;
          lStack_190 = plVar13[3];
        }
        else {
          local_1a8.sz = *pSVar20;
          local_1a8._0_8_ = (Size *)*plVar13;
        }
        local_1a8.obj = (void *)plVar13[1];
        *plVar13 = (long)pSVar20;
        plVar13[1] = 0;
        *(undefined1 *)&pSVar20->width = 0;
        std::__cxx11::string::operator=((string *)error,(string *)&local_1a8);
        if ((Size *)local_1a8._0_8_ != &local_1a8.sz) {
          operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_1a8.sz + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,
                          (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
        }
        if ((Size **)local_208._0_8_ != ppSVar9) {
          operator_delete((void *)local_208._0_8_,(ulong)((long)local_208.sz + 1));
        }
        if ((Size **)local_1c8.super__InputArray._0_8_ != ppSVar8) {
          operator_delete((void *)local_1c8.super__InputArray._0_8_,
                          (ulong)((long)local_1c8.super__InputArray.sz + 1));
        }
        __str.field_2._M_allocated_capacity = local_168._M_allocated_capacity;
        src_2._M_p = (pointer)local_178._0_8_;
        if ((UMat *)local_178._0_8_ == (UMat *)(local_178 + 0x10)) {
          return (UMat *)0x0;
        }
        goto LAB_00110b08;
      }
      this->actual_mask =
           ((int)(long)(((timestamp - dVar1) + this->accepted_timestamp_difference) /
                       this->timestamps_delta) + this->actual_mask) % (this->number_of_masks + 1);
      this->expected_timestamp = timestamp;
    }
    this->expected_timestamp = timestamp + this->timestamps_delta;
    src_2._M_p = (pointer)operator_new(0x50);
    cv::UMat::UMat((UMat *)src_2._M_p,iVar2,iVar3);
    if (this->actual_mask == this->number_of_masks) {
      this->actual_mask = 0;
      local_1a8.sz.width = 0;
      local_1a8.sz.height = 0;
      local_1a8.flags = 0x20a0000;
      local_1a8.obj = src_2._M_p;
      cv::UMat::convertTo((_OutputArray *)frame,(int)&local_1a8,1.0,0.0);
    }
    else {
      local_1a8.sz.width = 0;
      local_1a8.sz.height = 0;
      local_1a8.flags = 0x10a0000;
      local_208.obj =
           (this->masks).super__Vector_base<cv::UMat,_std::allocator<cv::UMat>_>._M_impl.
           super__Vector_impl_data._M_start + (ulong)this->actual_mask * 0x50;
      local_208.sz.width = 0;
      local_208.sz.height = 0;
      local_208.flags = 0x10a0000;
      local_1c8.super__InputArray.sz.width = 0;
      local_1c8.super__InputArray.sz.height = 0;
      local_1c8.super__InputArray.flags = 0x20a0000;
      local_1c8.super__InputArray.obj = src_2._M_p;
      local_1a8.obj = frame;
      p_Var15 = (_InputArray *)cv::noArray();
      cv::subtract(&local_1a8,&local_208,&local_1c8,p_Var15,0);
      this->actual_mask = this->actual_mask + 1;
    }
    if ((this->frames_block).count_of_elements == 0) {
      pUVar18 = (UMat *)0x0;
    }
    else {
      pUVar18 = (this->frames_block).data[(this->frames_block).last_element_index];
    }
    if (pUVar18 != (UMat *)0x0) {
      pUVar16 = (UMat *)operator_new(0x50);
      local_1a8.sz.width = 0;
      local_1a8.sz.height = 0;
      lStack_190 = 0;
      local_1a8._0_8_ = (Size *)0x0;
      local_1a8.obj = (UMat *)0x0;
      cv::UMat::UMat(pUVar16,this->frame_rows,this->frame_cols,0,&local_1a8,0);
      pUVar17 = CircularBuffer<cv::UMat_*>::push(&this->adjacent_frames_similarity_levels,pUVar16);
      bVar12 = OpenCLKernels::runKernelUpdateSimilarityLevels
                         (this->opencl_kernels,pUVar18,(UMat *)src_2._M_p,pUVar17,
                          this->flickering_threshold,pUVar16,&this->adjacent_frames_similarity_sum,
                          error);
      cv::UMat::~UMat(pUVar17);
      operator_delete(pUVar17,0x50);
      if (!bVar12) {
        cv::UMat::~UMat((UMat *)src_2._M_p);
        uVar27 = 0x50;
        goto LAB_00110b0b;
      }
    }
    local_38 = &this->frames_block;
    pUVar18 = CircularBuffer<cv::UMat_*>::push(local_38,(UMat *)src_2._M_p);
    if (pUVar18 != (UMat *)0x0) {
      pUVar16 = (UMat *)operator_new(0x50);
      local_1a8.sz.width = 0;
      local_1a8.sz.height = 0;
      lStack_190 = 0;
      local_1a8._0_8_ = (Size *)0x0;
      local_1a8.obj = (UMat *)0x0;
      cv::UMat::UMat(pUVar16,this->frame_rows,this->frame_cols,0,&local_1a8,0);
      pUVar17 = CircularBuffer<cv::UMat_*>::push
                          (&this->corresponding_frames_similarity_levels,pUVar16);
      bVar12 = OpenCLKernels::runKernelUpdateSimilarityLevels
                         (this->opencl_kernels,pUVar18,(UMat *)src_2._M_p,pUVar17,
                          this->flickering_threshold,pUVar16,
                          &this->corresponding_frames_similarity_sum,error);
      cv::UMat::~UMat(pUVar17);
      operator_delete(pUVar17,0x50);
      if (!bVar12) {
        return (UMat *)0x0;
      }
    }
    if (this->actual_mask != this->number_of_masks) {
      return (UMat *)src_2._M_p;
    }
    if ((this->frames_block).count_of_elements != (this->frames_block).count_of_slots) {
      return (UMat *)src_2._M_p;
    }
    local_b0 = &this->flicker_counter;
    bVar12 = OpenCLKernels::runKernelUpdateFlickerCounter
                       (this->opencl_kernels,&this->adjacent_frames_similarity_sum,
                        this->number_of_masks,&this->corresponding_frames_similarity_sum,
                        (float)this->block_size * 0.7,local_b0,error);
    if (bVar12) {
      lVar30 = 0;
      lVar31 = 0;
      local_180 = error;
      local_40 = this;
      while (pFVar10 = local_40, this_00 = local_40->opencl_kernels,
            lVar31 < (int)local_40->number_of_masks) {
        if ((int)(local_40->frames_block).count_of_elements < 1) {
          local_a8 = (UMat *)0x0;
        }
        else {
          local_a8 = (local_40->frames_block).data
                     [(int)((local_40->frames_block).first_element_index %
                           (local_40->frames_block).count_of_slots)];
        }
        pUVar18 = CircularBuffer<cv::UMat_*>::operator[](local_38,(int)lVar31 + 1);
        local_154 = pFVar10->max_allowed_flicker_duration;
        pUVar5 = (pFVar10->masks).super__Vector_base<cv::UMat,_std::allocator<cv::UMat>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        pcVar6 = (local_180->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar6,pcVar6 + local_180->_M_string_length);
        bVar12 = OpenCLKernels::runKernelUpdateMasks
                           (this_00,local_a8,pUVar18,local_b0,local_154,pUVar5 + lVar30,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        lVar30 = lVar30 + 0x50;
        lVar31 = lVar31 + 1;
        if (!bVar12) {
          return (UMat *)0x0;
        }
      }
      bVar12 = OpenCLKernels::runKernelZeroFlickerCounter
                         (this_00,local_40->max_allowed_flicker_duration,local_b0,local_180);
      if (bVar12) {
        return (UMat *)src_2._M_p;
      }
    }
  }
  else {
    uVar4 = *(uint *)(frame + 0xc);
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar24 = 1;
    if (9 < uVar7) {
      uVar27 = (ulong)uVar7;
      uVar11 = 4;
      do {
        uVar24 = uVar11;
        uVar19 = (uint)uVar27;
        if (uVar19 < 100) {
          uVar24 = uVar24 - 2;
          goto LAB_00110337;
        }
        if (uVar19 < 1000) {
          uVar24 = uVar24 - 1;
          goto LAB_00110337;
        }
        if (uVar19 < 10000) goto LAB_00110337;
        uVar27 = uVar27 / 10000;
        uVar11 = uVar24 + 4;
      } while (99999 < uVar19);
      uVar24 = uVar24 + 1;
    }
LAB_00110337:
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    local_180 = error;
    std::__cxx11::string::_M_construct((ulong)&__str,(char)uVar24 - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (__str._M_dataplus._M_p + (uVar4 >> 0x1f),uVar24,uVar7);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x117bfe);
    local_60 = &local_50;
    plVar21 = plVar13 + 2;
    if ((long *)*plVar13 == plVar21) {
      local_50 = *plVar21;
      lStack_48 = plVar13[3];
    }
    else {
      local_50 = *plVar21;
      local_60 = (long *)*plVar13;
    }
    local_58 = plVar13[1];
    *plVar13 = (long)plVar21;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_60);
    puVar22 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar22) {
      local_e0 = *puVar22;
      lStack_d8 = plVar13[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar22;
      local_f0 = (ulong *)*plVar13;
    }
    local_e8 = plVar13[1];
    *plVar13 = (long)puVar22;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    uVar4 = *(uint *)(frame + 8);
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar24 = 1;
    if (9 < uVar7) {
      uVar27 = (ulong)uVar7;
      uVar11 = 4;
      do {
        uVar24 = uVar11;
        uVar19 = (uint)uVar27;
        if (uVar19 < 100) {
          uVar24 = uVar24 - 2;
          goto LAB_001104a3;
        }
        if (uVar19 < 1000) {
          uVar24 = uVar24 - 1;
          goto LAB_001104a3;
        }
        if (uVar19 < 10000) goto LAB_001104a3;
        uVar27 = uVar27 / 10000;
        uVar11 = uVar24 + 4;
      } while (99999 < uVar19);
      uVar24 = uVar24 + 1;
    }
LAB_001104a3:
    __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
    std::__cxx11::string::_M_construct((ulong)&__str_1,(char)uVar24 - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (__str_1._M_dataplus._M_p + (uVar4 >> 0x1f),uVar24,uVar7);
    uVar27 = 0xf;
    if (local_f0 != &local_e0) {
      uVar27 = local_e0;
    }
    if (uVar27 < __str_1._M_string_length + local_e8) {
      uVar26 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        uVar26 = __str_1.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < __str_1._M_string_length + local_e8) goto LAB_00110537;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,(ulong)local_f0);
    }
    else {
LAB_00110537:
      puVar14 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_f0,(ulong)__str_1._M_dataplus._M_p);
    }
    local_d0 = &local_c0;
    plVar13 = puVar14 + 2;
    if ((long *)*puVar14 == plVar13) {
      local_c0 = *plVar13;
      uStack_b8 = puVar14[3];
    }
    else {
      local_c0 = *plVar13;
      local_d0 = (long *)*puVar14;
    }
    local_c8 = puVar14[1];
    *puVar14 = plVar13;
    puVar14[1] = 0;
    *(undefined1 *)plVar13 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_d0);
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar23) {
      local_1e8.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_1e8.field_2._8_8_ = plVar13[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_1e8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_1e8._M_string_length = plVar13[1];
    *plVar13 = (long)paVar23;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    uVar4 = this->frame_cols;
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar24 = 1;
    if (9 < uVar7) {
      uVar27 = (ulong)uVar7;
      uVar11 = 4;
      do {
        uVar24 = uVar11;
        uVar19 = (uint)uVar27;
        if (uVar19 < 100) {
          uVar24 = uVar24 - 2;
          goto LAB_00110671;
        }
        if (uVar19 < 1000) {
          uVar24 = uVar24 - 1;
          goto LAB_00110671;
        }
        if (uVar19 < 10000) goto LAB_00110671;
        uVar27 = uVar27 / 10000;
        uVar11 = uVar24 + 4;
      } while (99999 < uVar19);
      uVar24 = uVar24 + 1;
    }
LAB_00110671:
    __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
    std::__cxx11::string::_M_construct((ulong)&__str_2,(char)uVar24 - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (__str_2._M_dataplus._M_p + (uVar4 >> 0x1f),uVar24,uVar7);
    uVar26 = (Size *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar26 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar26 < (Size *)(__str_2._M_string_length + local_1e8._M_string_length)) {
      uVar26 = (Size *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
        uVar26 = __str_2.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < (Size *)(__str_2._M_string_length + local_1e8._M_string_length))
      goto LAB_001106f9;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&__str_2,0,(char *)0x0,(ulong)local_1e8._M_dataplus._M_p);
    }
    else {
LAB_001106f9:
      puVar14 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)__str_2._M_dataplus._M_p);
    }
    local_178._0_8_ = local_178 + 0x10;
    pUVar18 = (UMat *)(puVar14 + 2);
    if ((UMat *)*puVar14 == pUVar18) {
      local_168._M_allocated_capacity = *(undefined8 *)pUVar18;
      local_168._8_8_ = puVar14[3];
    }
    else {
      local_168._M_allocated_capacity = *(undefined8 *)pUVar18;
      local_178._0_8_ = (UMat *)*puVar14;
    }
    local_178._8_8_ = puVar14[1];
    *puVar14 = pUVar18;
    puVar14[1] = 0;
    *pUVar18 = (UMat)0x0;
    plVar13 = (long *)std::__cxx11::string::append(local_178);
    ppSVar8 = (Size **)&local_1c8.super__InputArray.sz;
    pSVar20 = (Size *)(plVar13 + 2);
    if ((Size *)*plVar13 == pSVar20) {
      local_1c8.super__InputArray.sz = *pSVar20;
      lStack_1b0 = plVar13[3];
      local_1c8.super__InputArray._0_8_ = ppSVar8;
    }
    else {
      local_1c8.super__InputArray.sz = *pSVar20;
      local_1c8.super__InputArray._0_8_ = (Size *)*plVar13;
    }
    local_1c8.super__InputArray.obj = (void *)plVar13[1];
    *plVar13 = (long)pSVar20;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    uVar4 = this->frame_rows;
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar24 = 1;
    if (9 < uVar7) {
      uVar27 = (ulong)uVar7;
      uVar11 = 4;
      do {
        uVar24 = uVar11;
        uVar19 = (uint)uVar27;
        if (uVar19 < 100) {
          uVar24 = uVar24 - 2;
          goto LAB_00110831;
        }
        if (uVar19 < 1000) {
          uVar24 = uVar24 - 1;
          goto LAB_00110831;
        }
        if (uVar19 < 10000) goto LAB_00110831;
        uVar27 = uVar27 / 10000;
        uVar11 = uVar24 + 4;
      } while (99999 < uVar19);
      uVar24 = uVar24 + 1;
    }
LAB_00110831:
    paVar23 = &__str_3.field_2;
    __str_3._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct((ulong)&__str_3,(char)uVar24 - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (__str_3._M_dataplus._M_p + (uVar4 >> 0x1f),uVar24,uVar7);
    SVar25.width = 0xf;
    SVar25.height = 0;
    if ((Size **)local_1c8.super__InputArray._0_8_ != ppSVar8) {
      SVar25 = local_1c8.super__InputArray.sz;
    }
    if ((ulong)SVar25 < __str_3._M_string_length + (long)local_1c8.super__InputArray.obj) {
      uVar26._0_4_ = 0xf;
      uVar26._4_4_ = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_3._M_dataplus._M_p != paVar23) {
        uVar26 = __str_3.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < __str_3._M_string_length + (long)local_1c8.super__InputArray.obj)
      goto LAB_001108b9;
      plVar13 = (long *)std::__cxx11::string::replace
                                  ((ulong)&__str_3,0,(char *)0x0,local_1c8.super__InputArray._0_8_);
    }
    else {
LAB_001108b9:
      plVar13 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_1c8,(ulong)__str_3._M_dataplus._M_p);
    }
    local_208._0_8_ = &local_208.sz;
    pSVar20 = (Size *)(plVar13 + 2);
    if ((Size *)*plVar13 == pSVar20) {
      local_208.sz = *pSVar20;
      lStack_1f0 = plVar13[3];
    }
    else {
      local_208.sz = *pSVar20;
      local_208._0_8_ = (Size *)*plVar13;
    }
    local_208.obj = (void *)plVar13[1];
    *plVar13 = (long)pSVar20;
    plVar13[1] = 0;
    *(undefined1 *)&pSVar20->width = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_208);
    pSVar20 = (Size *)(plVar13 + 2);
    if ((Size *)*plVar13 == pSVar20) {
      local_1a8.sz = *pSVar20;
      lStack_190 = plVar13[3];
      local_1a8._0_8_ = &local_1a8.sz;
    }
    else {
      local_1a8.sz = *pSVar20;
      local_1a8._0_8_ = (Size *)*plVar13;
    }
    local_1a8.obj = (void *)plVar13[1];
    *plVar13 = (long)pSVar20;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_180,(string *)&local_1a8);
    if ((Size *)local_1a8._0_8_ != &local_1a8.sz) {
      operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_1a8.sz + 1));
    }
    if ((Size *)local_208._0_8_ != &local_208.sz) {
      operator_delete((void *)local_208._0_8_,(ulong)((long)local_208.sz + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_3._M_dataplus._M_p != paVar23) {
      operator_delete(__str_3._M_dataplus._M_p,__str_3.field_2._M_allocated_capacity + 1);
    }
    if ((Size **)local_1c8.super__InputArray._0_8_ != ppSVar8) {
      operator_delete((void *)local_1c8.super__InputArray._0_8_,
                      (ulong)((long)local_1c8.super__InputArray.sz + 1));
    }
    if ((UMat *)local_178._0_8_ != (UMat *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,local_168._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
      operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    src_2._M_p = __str._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p == &__str.field_2) {
      return (UMat *)0x0;
    }
LAB_00110b08:
    uVar27 = __str.field_2._M_allocated_capacity + 1;
LAB_00110b0b:
    operator_delete(src_2._M_p,uVar27);
  }
  return (UMat *)0x0;
}

Assistant:

UMat *FlickerRemover::removeFlickering(const UMat &frame, double timestamp, string &error)
{
    if(frame.rows != frame_rows || frame.cols != frame_cols) {
        error = "Flickering cannot be removed. Size of the frame: " + to_string(frame.cols) + "x" +
                to_string(frame.rows) + " is different than expected: " + to_string(frame_cols) + "x" +
                to_string(frame_rows) + ".";
        return nullptr;
    }
    if(!timestampIsCloseToExpectedTimestamp(timestamp)) {
        //very unlikely. Should not happen...
        if(timestamp < expected_timestamp) {
            error = "Received unexpected timestamp: " + to_string(timestamp) + " Expected value close to: " +
                    to_string(expected_timestamp);
            return nullptr;
        }
        //calculate number of frames that were dropped
        auto number_of_dropped = (unsigned int) ((timestamp - expected_timestamp + accepted_timestamp_difference) /
                                                 timestamps_delta);
        actual_mask = (actual_mask + number_of_dropped) % (number_of_masks + 1);
        expected_timestamp = timestamp;
    }
    calculateNextExpectedTimestamp(timestamp);

    auto frame_copy = new UMat(frame_rows, frame_cols, CV_8UC1);

    if(actual_mask == number_of_masks) {
        actual_mask = 0;
        frame.convertTo(*frame_copy, CV_8UC1);
    } else {
        subtract(frame, masks[actual_mask], *frame_copy, noArray(), CV_8UC1);
        actual_mask++;
    }

    auto last_frame = frames_block.last();
    if(last_frame != nullptr) {
        auto new_adjacent_similarity = new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0));
        auto old_adjacent_similarity = adjacent_frames_similarity_levels.push(new_adjacent_similarity);

        auto ret = opencl_kernels.runKernelUpdateSimilarityLevels(*last_frame, *frame_copy, *old_adjacent_similarity,
                                                                  flickering_threshold, *new_adjacent_similarity,
                                                                  adjacent_frames_similarity_sum, error);
        delete old_adjacent_similarity;
        if(!ret) {
            delete frame_copy;
            return nullptr;
        }
    }

    //push returns pointer to the allocated earlier matrix, but do not delete, since we already returned this pointer
    //outside of this method, and it is the responsibility of the caller to delete this pointer.
    auto prev_frame = frames_block.push(frame_copy);

    if(prev_frame != nullptr) {
        auto new_similarity_levels = new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0));
        auto old_similarity_levels = corresponding_frames_similarity_levels.push(new_similarity_levels);

        auto ret = opencl_kernels.runKernelUpdateSimilarityLevels(*prev_frame, *frame_copy, *old_similarity_levels,
                                                                  flickering_threshold, *new_similarity_levels,
                                                                  corresponding_frames_similarity_sum, error);
        delete old_similarity_levels;
        if(!ret) {
            return nullptr;
        }
    }

    if(actual_mask == number_of_masks && frames_block.isFull()) {
        auto ret = opencl_kernels.runKernelUpdateFlickerCounter(adjacent_frames_similarity_sum, number_of_masks,
                                                                corresponding_frames_similarity_sum,
                                                                0.7f * (float) block_size, flicker_counter, error);
        if(!ret) {
            return nullptr;
        }
        for(int i = 0; i < (int) number_of_masks; i++) {
            ret = opencl_kernels.runKernelUpdateMasks(*(frames_block[0]), *(frames_block[i + 1]), flicker_counter,
                                                      max_allowed_flicker_duration, masks[i], error);
            if(!ret) {
                return nullptr;
            }
        }
        ret = opencl_kernels.runKernelZeroFlickerCounter(max_allowed_flicker_duration, flicker_counter, error);
        if(!ret) {
            return nullptr;
        }
    }
    return frame_copy;
}